

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

ostream * pstack::Procman::operator<<(ostream *os,SigInfo *sip)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  iterator iVar5;
  iterator iVar6;
  long lVar7;
  siginfo_t *psVar8;
  undefined8 *puVar9;
  uint *puVar10;
  pair<const_int,_const_char_*> *ppVar11;
  byte bVar12;
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_00;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_01;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_02;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_03;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_04;
  initializer_list<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
  __l_05;
  pair<const_int,_const_char_*> local_6d0 [16];
  pair<const_int,_const_char_*> local_5d0 [10];
  pair<const_int,_const_char_*> local_530 [9];
  pair<const_int,_const_char_*> local_4a0 [7];
  pair<const_int,_const_char_*> local_430 [5];
  pair<const_int,_const_char_*> local_3e0 [5];
  uint local_390 [2];
  siginfo_t si;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_308;
  undefined4 local_2d8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_2d0;
  undefined4 local_2a0;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_298;
  undefined4 local_268;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_260;
  undefined4 local_230;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_228;
  undefined4 local_1f8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_1f0;
  undefined4 local_1c0;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_1b8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_188;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_158;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_128;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_f8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_c8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_98;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_68;
  less<int> local_36;
  allocator_type local_35;
  less<int> local_34;
  allocator_type local_33;
  less<int> local_32;
  allocator_type local_31;
  less<int> local_30;
  allocator_type local_2f;
  less<int> local_2e;
  allocator_type local_2d;
  less<int> local_2c;
  allocator_type local_2b;
  less<int> local_2a;
  allocator_type local_29;
  
  bVar12 = 0;
  psVar8 = sip->si;
  puVar10 = local_390;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    iVar2 = psVar8->si_errno;
    puVar10[0] = psVar8->si_signo;
    puVar10[1] = iVar2;
    psVar8 = (siginfo_t *)&psVar8->si_code;
    puVar10 = puVar10 + 2;
  }
  if (operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes == '\0') {
    iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes);
    if (iVar2 != 0) {
      puVar9 = &DAT_001517a0;
      ppVar11 = local_4a0;
      for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined8 *)ppVar11 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
        ppVar11 = (pair<const_int,_const_char_*> *)&ppVar11[-(ulong)bVar12].second;
      }
      __l._M_len = 7;
      __l._M_array = local_4a0;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_188,__l,&local_36,&local_35);
      si._sifields._pad[0x1a] = 0xb;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_308,&local_188);
      memcpy(local_6d0,&DAT_00151810,0x100);
      __l_00._M_len = 0x10;
      __l_00._M_array = local_6d0;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_158,__l_00,&local_34,&local_33);
      local_2d8 = 0;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_2d0,&local_158);
      memcpy(local_530,&DAT_00151910,0x90);
      __l_01._M_len = 9;
      __l_01._M_array = local_530;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_128,__l_01,&local_32,&local_31);
      local_2a0 = 4;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_298,&local_128);
      memcpy(local_5d0,&DAT_001519a0,0xa0);
      __l_02._M_len = 10;
      __l_02._M_array = local_5d0;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_f8,__l_02,&local_30,&local_2f);
      local_268 = 8;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_260,&local_f8);
      puVar9 = &DAT_00151a40;
      ppVar11 = local_430;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined8 *)ppVar11 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
        ppVar11 = (pair<const_int,_const_char_*> *)&ppVar11[-(ulong)bVar12].second;
      }
      __l_03._M_len = 5;
      __l_03._M_array = local_430;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_c8,__l_03,&local_2e,&local_2d);
      local_230 = 7;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_228,&local_c8);
      puVar9 = &DAT_00151a90;
      ppVar11 = local_3e0;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined8 *)ppVar11 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
        ppVar11 = (pair<const_int,_const_char_*> *)&ppVar11[-(ulong)bVar12].second;
      }
      __l_04._M_len = 5;
      __l_04._M_array = local_3e0;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
           *)&local_98,__l_04,&local_2c,&local_2b);
      local_1f8 = 5;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_1f0,&local_98);
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl._0_8_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1c0 = 0x1f;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::_Rb_tree(&local_1b8,&local_68);
      __l_05._M_len = 7;
      __l_05._M_array = (iterator)((long)&si._sifields + 0x68);
      std::
      map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
      ::map(&operator<<::codes,__l_05,&local_2a,&local_29);
      lVar7 = 0x158;
      do {
        std::
        _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                     *)((long)&si._sifields + lVar7 + 0x68));
        lVar7 = lVar7 + -0x38;
      } while (lVar7 != -0x30);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_68);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_98);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_c8);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_f8);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_158);
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree(&local_188);
      __cxa_atexit(std::
                   map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
                   ::~map,&operator<<::codes,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes);
    }
  }
  uVar1 = local_390[0];
  pcVar3 = (char *)sigdescr_np(local_390[0]);
  poVar4 = std::operator<<(os,pcVar3);
  poVar4 = std::operator<<(poVar4," SIG");
  pcVar3 = (char *)sigabbrev_np(uVar1);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,", si_code ");
  std::ostream::operator<<(poVar4,si.si_signo);
  iVar5 = std::
          _Rb_tree<int,_std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
          ::find(&operator<<::codes._M_t,(key_type *)local_390);
  if ((_Rb_tree_header *)iVar5._M_node == &operator<<::codes._M_t._M_impl.super__Rb_tree_header) {
    si._sifields._pad[0x1a] = 0;
    iVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
            ::find(&operator<<::codes._M_t,si._sifields._pad + 0x1a);
    if ((_Rb_tree_header *)iVar5._M_node == &operator<<::codes._M_t._M_impl.super__Rb_tree_header)
    goto LAB_00138491;
  }
  iVar6 = std::
          _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                  *)&iVar5._M_node[1]._M_parent,&si.si_signo);
  if (iVar6._M_node != (_Base_ptr)&iVar5._M_node[1]._M_left) {
    poVar4 = std::operator<<(os," - ");
    std::operator<<(poVar4,(char *)iVar6._M_node[1]._M_parent);
  }
LAB_00138491:
  if ((local_390[0] < 0xc) && ((0x9b0U >> (local_390[0] & 0x1f) & 1) != 0)) {
    poVar4 = std::operator<<(os,", fault address ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, const SigInfo &sip) {
   const auto si = sip.si;

   static std::map<int, std::map<int, const char *>> codes {
         { SIGSEGV,  {
                     { SEGV_MAPERR, "address not mapped to object" },
                        { SEGV_ACCERR, "invalid permissions for mapped object" },
                        { SEGV_BNDERR, "address failed bouds checks" },
                        { SEGV_ACCADI, "ADI not enabled" },
                        { SEGV_ADIDERR, "disrupting MCD error" },
                        { SEGV_ADIPERR, "precise MCD exception" },
                        { SEGV_MTEAERR, "asynchronous ARM MTE error" },
                  } },
         { 0,     {
                     { SI_USER, "sent by kill/sigsend/raise" },
                     { SI_KERNEL, "sent by kernel" },
                     { SI_QUEUE, "sent by sigqueue" },
                     { SI_TIMER, "sent by timer expiration" },
                     { SI_MESGQ, "sent by real time mesq state change" },
                     { SI_ASYNCIO, "sent by AIO completion" },
                     { SI_SIGIO, "sent by queued SIGIO" },
                     { SI_TKILL, "sent by tkill syscall" },
                     { SI_DETHREAD, "sent by execve killing subsidiary threads" },
                     { SI_ASYNCNL, "sent by glibc async name lookup completion" },
                     { POLL_IN, "data input available" },
                     { POLL_OUT, "output buffers available" },
                     { POLL_MSG, "input message available" },
                     { POLL_ERR, "I/O error" },
                     { POLL_PRI, "high priority input available" },
                     { POLL_HUP, "device disconnected" },
                  } },
         { SIGILL, {
                      { ILL_ILLOPC, "illegal opcode" },
                      { ILL_ILLOPN, "illegal operand" },
                      { ILL_ILLADR, "illegal address mode" },
                      { ILL_ILLTRP, "illegal trap" },
                      { ILL_PRVOPC, "privileged opcode" },
                      { ILL_PRVREG, "privileged register" },
                      { ILL_COPROC, "coprocessor error" },
                      { ILL_BADSTK, "internal stack error" },
                      { ILL_BADIADDR, "unimplemented instruction address" },
                      /*
                      { __ILL_BREAK, "illegal break" },
                      { __ILL_BNDMOD, "bundle-pudate (modification) in proress" }
                      */
                   } },
         { SIGFPE, {
                      { FPE_INTDIV, "integer divide by zero" },
                      { FPE_INTOVF, "integer overflow" },
                      { FPE_FLTDIV, "floating point divide by zero" },
                      { FPE_FLTOVF, "floating point overflow" },
                      { FPE_FLTUND, "floating point underflow" },
                      { FPE_FLTRES, "floating point inexact result" },
                      { FPE_FLTINV, "floating point invalid operation" },
                      { FPE_FLTSUB, "subscript out of range" },
                      /*
                      { __FPE_DECOVF, "decimal overflow" },
                      { __FPE_DECDIV, "decimal division" },
                      { __FPE_DECERR, "packed decimal error" },
                      { __FPE_INVASC, "invalid ASCII digit" },
                      { __FPE_INVDEC, "invalid decimal digit" },
                      */
                      { FPE_FLTUNK, "undiagnosed floating point exception" },
                      { FPE_CONDTRAP, "trap condition" },
                   } },
         { SIGBUS, {
                      { BUS_ADRALN, "invalid address alignment" },
                      { BUS_ADRERR, "non-existent physical address" },
                      { BUS_OBJERR, "object specific hardware error" },
                      { BUS_MCEERR_AR, "hardware memory error consumed on a machine check: action required" },
                      { BUS_MCEERR_AO, "hardware memory error consumed on a machine check: action optional" },
                   }
         },
         { SIGTRAP, {
                       { TRAP_BRKPT, "process breakpoint" },
                       { TRAP_TRACE, "process trace trap" },
                       { TRAP_BRANCH, "process taken branch trap" },
                       { TRAP_HWBKPT, "hardware breakpoint/watchpoint" },
                       { TRAP_UNK, "undiagnosed trap" },
                       /*
                       { TRAP_PERF, "perf event with sigtrap=1" },
                       */
                    }
         },
         {  SIGSYS, {
                       /*
                       { SYS_SECCOMP, "seccomp triggered" },
                       { SYS_USER_DISPATCH, "syscall user dispatch triggered" }
                       */
                    }
         },
   };

   os << sigdescr_np( si.si_signo )
      << " SIG" << sigabbrev_np( si.si_signo )
      << ", si_code " << si.si_code;

   auto codesforsig = codes.find( si.si_signo );
   if (codesforsig == codes.end()) {
      codesforsig = codes.find( 0 );
   }

   if (codesforsig != codes.end()) {
      auto code = codesforsig->second.find( si.si_code );
      if (code != codesforsig->second.end())
            os << " - " << code->second;
   }

   switch (si.si_signo) {
      case SIGILL:
      case SIGFPE:
      case SIGBUS:
      case SIGTRAP:
#ifdef SIGEMT
      case SIGEMT:
#endif
      case SIGSEGV: {
         os << ", fault address " << std::hex << si.si_addr << std::dec;
         break;
      }


   }
   return os;
}